

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

void __thiscall
chaiscript::eval::Arg_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::Arg_AST_Node
          (Arg_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,string *t_ast_node_text,
          Parse_Location *t_loc,
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
          *t_children)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_80;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  local_60;
  Parse_Location local_48;
  
  local_80._M_dataplus._M_p = (t_ast_node_text->_M_dataplus)._M_p;
  paVar1 = &t_ast_node_text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&t_ast_node_text->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80._M_string_length = t_ast_node_text->_M_string_length;
  (t_ast_node_text->_M_dataplus)._M_p = (pointer)paVar1;
  t_ast_node_text->_M_string_length = 0;
  (t_ast_node_text->field_2)._M_local_buf[0] = '\0';
  local_48.start = t_loc->start;
  local_48.end = t_loc->end;
  local_48.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (t_loc->filename).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (t_loc->filename).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_60.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_60.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_60.
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_children->
       super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_children->
  super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::AST_Node_Impl
            (&this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,&local_80,Arg_List,
             &local_48,&local_60);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::~vector(&local_60);
  if (local_48.filename.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.filename.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)&PTR_get_children_005b5e88;
  return;
}

Assistant:

Arg_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_Node_Impl_Ptr<T>> t_children)
          : AST_Node_Impl<T>(std::move(t_ast_node_text), AST_Node_Type::Arg_List, std::move(t_loc), std::move(t_children)) {
      }